

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O0

void __thiscall QtPrivate::QCalendarModel::internalUpdate(QCalendarModel *this)

{
  int iVar1;
  int iVar2;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  QModelIndex end;
  QModelIndex begin;
  undefined1 local_70 [24];
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 local_40 [24];
  undefined1 *local_28;
  undefined1 *puStack_20;
  undefined1 *local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_20 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x519892);
  (**(code **)(*(long *)in_RDI + 0x60))(&local_28,in_RDI,0,0,local_40);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = *(int *)(in_RDI + 0x10);
  iVar2 = *(int *)(in_RDI + 0x14);
  QModelIndex::QModelIndex((QModelIndex *)0x5198fd);
  (**(code **)(*(long *)in_RDI + 0x60))(&local_58,in_RDI,iVar2 + 5,iVar1 + 6,local_70);
  QList<int>::QList((QList<int> *)0x519945);
  QAbstractItemModel::dataChanged(in_RDI,(QModelIndex *)&local_28,(QList_conflict2 *)&local_58);
  QList<int>::~QList((QList<int> *)0x519968);
  QAbstractItemModel::headerDataChanged((Orientation)in_RDI,2,0);
  QAbstractItemModel::headerDataChanged((Orientation)in_RDI,1,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarModel::internalUpdate()
{
    QModelIndex begin = index(0, 0);
    QModelIndex end = index(m_firstRow + RowCount - 1, m_firstColumn + ColumnCount - 1);
    emit dataChanged(begin, end);
    emit headerDataChanged(Qt::Vertical, 0, m_firstRow + RowCount - 1);
    emit headerDataChanged(Qt::Horizontal, 0, m_firstColumn + ColumnCount - 1);
}